

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dashel-posix.cpp
# Opt level: O0

ssize_t __thiscall Dashel::SocketStream::write(SocketStream *this,int __fd,void *__buf,size_t __n)

{
  int iVar1;
  SocketStream *pSVar2;
  undefined4 extraout_var;
  undefined4 in_register_00000034;
  int in_R8D;
  size_t size_local;
  void *data_local;
  SocketStream *this_local;
  
  if ((this->super_DisconnectableStream).super_SelectableStream.fd < 0) {
    __assert_fail("fd >= 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/aseba-community[P]dashel/dashel/dashel-posix.cpp"
                  ,0x1be,"virtual void Dashel::SocketStream::write(const void *, const size_t)");
  }
  pSVar2 = this;
  if (__buf != (void *)0x0) {
    if (__buf < (void *)0x10000) {
      ExpandableBuffer::add
                ((ExpandableBuffer *)&(this->super_DisconnectableStream).field_0x1020,
                 (void *)CONCAT44(in_register_00000034,__fd),(size_t)__buf);
      pSVar2 = (SocketStream *)
               ExpandableBuffer::size
                         ((ExpandableBuffer *)&(this->super_DisconnectableStream).field_0x1020);
      if ((SocketStream *)0xffff < pSVar2) {
        iVar1 = (*(this->super_DisconnectableStream).super_SelectableStream._vptr_SelectableStream
                  [5])();
        pSVar2 = (SocketStream *)CONCAT44(extraout_var,iVar1);
      }
    }
    else {
      (*(this->super_DisconnectableStream).super_SelectableStream._vptr_SelectableStream[5])();
      pSVar2 = (SocketStream *)send(this,__fd,__buf,__n,in_R8D);
    }
  }
  return (ssize_t)pSVar2;
}

Assistant:

virtual void write(const void* data, const size_t size)
		{
			assert(fd >= 0);

			if (size == 0)
				return;

#ifdef TCP_CORK
			send(data, size);
#else
			if (size >= SEND_BUFFER_SIZE_LIMIT)
			{
				flush();
				send(data, size);
			}
			else
			{
				sendBuffer.add(data, size);
				if (sendBuffer.size() >= SEND_BUFFER_SIZE_LIMIT)
					flush();
			}
#endif
		}